

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

monster_race * lookup_monster(char *name)

{
  char *__s2;
  int iVar1;
  wchar_t wVar2;
  monster_race *pmVar3;
  ulong uVar4;
  long lVar5;
  monster_race *pmVar6;
  
  if (z_info->r_max == 0) {
    pmVar3 = (monster_race *)0x0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    pmVar3 = (monster_race *)0x0;
    do {
      pmVar6 = r_info;
      __s2 = *(char **)(r_info->flags + lVar5 + -0x4c);
      if (__s2 != (char *)0x0) {
        iVar1 = strcmp(name,__s2);
        if (iVar1 == 0) {
          return (monster_race *)(pmVar6->flags + lVar5 + -0x5c);
        }
        pmVar6 = (monster_race *)(pmVar6->flags + lVar5 + -0x5c);
        wVar2 = my_stricmp(name,__s2);
        if (wVar2 == L'\0') {
          pmVar3 = pmVar6;
        }
        if ((pmVar3 == (monster_race *)0x0) &&
           (pmVar3 = (monster_race *)my_stristr(pmVar6->name,name), pmVar3 != (monster_race *)0x0))
        {
          pmVar3 = pmVar6;
        }
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0xd0;
    } while (uVar4 < z_info->r_max);
  }
  return pmVar3;
}

Assistant:

struct monster_race *lookup_monster(const char *name)
{
	int i;
	struct monster_race *closest = NULL;

	/* Look for it */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		if (!race->name)
			continue;

		/* Test for equality */
		if (streq(name, race->name))
			return race;

		/* Test for near equality */
		if (my_stricmp(name, race->name) == 0)
			closest = race;

		/* Test for close matches */
		if (!closest && my_stristr(race->name, name))
			closest = race;
	}

	/* Return our best match */
	return closest;
}